

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

FieldDescriptor ** google::protobuf::compiler::java::SortFieldsByNumber(Descriptor *descriptor)

{
  int iVar1;
  undefined1 auVar2 [16];
  FieldDescriptor **ppFVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  iVar1 = *(int *)(descriptor + 0x2c);
  uVar7 = (ulong)iVar1;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)uVar7) {
    uVar6 = uVar7 * 8;
  }
  ppFVar3 = (FieldDescriptor **)operator_new__(uVar6);
  auVar2 = _DAT_00352680;
  if (0 < (long)uVar7) {
    lVar4 = *(long *)(descriptor + 0x30);
    lVar5 = uVar7 - 1;
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar8 = auVar8 ^ _DAT_00352680;
    auVar9 = _DAT_00352670;
    do {
      auVar11 = auVar9 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                  auVar8._4_4_ < auVar11._4_4_) & 1)) {
        *(long *)((long)ppFVar3 + lVar5) = lVar4;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        *(long *)((long)ppFVar3 + lVar5 + 8) = lVar4 + 0xa8;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar5 = lVar5 + 0x10;
      lVar4 = lVar4 + 0x150;
    } while ((ulong)(iVar1 + 1U >> 1) << 4 != lVar5);
  }
  if (iVar1 != 0) {
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::FieldOrderingByNumber>>
              (ppFVar3,ppFVar3 + uVar7,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::FieldOrderingByNumber>>
              (ppFVar3,ppFVar3 + uVar7);
  }
  return ppFVar3;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
    new const FieldDescriptor*[descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  std::sort(fields, fields + descriptor->field_count(),
            FieldOrderingByNumber());
  return fields;
}